

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  long lVar2;
  unsigned_long uVar3;
  char *pcVar4;
  uint uVar5;
  ulong dindex;
  allocator local_ba;
  allocator local_b9;
  Directory d;
  string startPath;
  string finishPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string fname;
  
  lVar2 = std::__cxx11::string::find((char *)path,0x1b51db);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,path);
    return;
  }
  std::__cxx11::string::substr((ulong)&startPath,(ulong)path);
  std::__cxx11::string::substr((ulong)&finishPath,(ulong)path);
  cmsys::Directory::Directory(&d);
  bVar1 = cmsys::Directory::Load(&d,&startPath);
  if (bVar1) {
    uVar5 = 0;
    while( true ) {
      uVar3 = cmsys::Directory::GetNumberOfFiles(&d);
      dindex = (ulong)uVar5;
      if (uVar3 <= dindex) break;
      pcVar4 = cmsys::Directory::GetFile(&d,dindex);
      std::__cxx11::string::string((string *)&fname,pcVar4,&local_b9);
      bVar1 = std::operator!=(&fname,".");
      if (bVar1) {
        pcVar4 = cmsys::Directory::GetFile(&d,dindex);
        std::__cxx11::string::string((string *)&local_70,pcVar4,&local_ba);
        bVar1 = std::operator!=(&local_70,"..");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&fname);
        if (bVar1) {
          std::__cxx11::string::string((string *)&fname,(string *)&startPath);
          std::__cxx11::string::append((char *)&fname);
          cmsys::Directory::GetFile(&d,dindex);
          std::__cxx11::string::append((char *)&fname);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&fname);
          if (bVar1) {
            std::__cxx11::string::append((string *)&fname);
            GlobDirs(&fname,files);
          }
          goto LAB_0012d838;
        }
      }
      else {
LAB_0012d838:
        std::__cxx11::string::~string((string *)&fname);
      }
      uVar5 = uVar5 + 1;
    }
  }
  cmsys::Directory::~Directory(&d);
  std::__cxx11::string::~string((string *)&finishPath);
  std::__cxx11::string::~string((string *)&startPath);
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = startPath;
        fname += "/";
        fname += d.GetFile(i);
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}